

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void P_NightmareRespawn(AActor *mobj)

{
  double *pdVar1;
  PClass *pPVar2;
  BYTE *pBVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AActor *actor;
  double dVar6;
  double dVar7;
  DVector3 local_28;
  
  if ((mobj->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar5 = (**(mobj->super_DThinker).super_DObject._vptr_DObject)(mobj);
    (mobj->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
  }
  pPVar2 = (mobj->super_DThinker).super_DObject.Class;
  pBVar3 = pPVar2->Defaults;
  mobj->skillrespawncount = mobj->skillrespawncount + 1;
  if ((pBVar3[0x1bd] & 1) == 0) {
    dVar6 = *(double *)(&DAT_00603bb0 + (ulong)((pBVar3[0x1c0] & 0x40) == 0) * 8);
  }
  else {
    dVar6 = 2147483647.0;
  }
  if (pPVar2 == (PClass *)0x0) {
    iVar5 = (**(mobj->super_DThinker).super_DObject._vptr_DObject)(mobj);
    (mobj->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar5);
  }
  local_28.X = (mobj->SpawnPoint).X;
  local_28.Y = (mobj->SpawnPoint).Y;
  local_28.Z = dVar6;
  actor = AActor::StaticSpawn((PClassActor *)(mobj->super_DThinker).super_DObject.Class,&local_28,
                              NO_REPLACE,true);
  if ((dVar6 != -2147483648.0) || (NAN(dVar6))) {
    if ((dVar6 != 2147483647.0) || (NAN(dVar6))) goto LAB_0042409b;
    dVar7 = (actor->__Pos).Z - (mobj->SpawnPoint).Z;
  }
  else {
    dVar7 = (mobj->SpawnPoint).Z + (actor->__Pos).Z;
    (actor->__Pos).Z = dVar7;
    if (dVar7 < actor->floorz) {
      (actor->__Pos).Z = actor->floorz;
    }
    if ((actor->__Pos).Z + actor->Height <= actor->ceilingz) goto LAB_0042409b;
    dVar7 = actor->ceilingz - actor->Height;
  }
  (actor->__Pos).Z = dVar7;
LAB_0042409b:
  P_FindFloorCeiling(actor,0xe);
  if ((dVar6 == -2147483648.0) && (!NAN(dVar6))) {
    dVar6 = actor->floorz;
    pdVar1 = &(actor->__Pos).Z;
    if (*pdVar1 <= dVar6 && dVar6 != *pdVar1) {
      (actor->__Pos).Z = dVar6;
    }
    if (actor->ceilingz < (actor->__Pos).Z + actor->Height) {
      (actor->__Pos).Z = actor->ceilingz - actor->Height;
    }
  }
  local_28.X = (actor->__Pos).X;
  local_28.Y = (actor->__Pos).Y;
  bVar4 = P_CheckPosition(actor,(DVector2 *)&local_28,true);
  if (bVar4) {
    dVar6 = (actor->__Pos).Z;
    (actor->SpawnPoint).Z = (mobj->SpawnPoint).Z;
    (actor->SpawnPoint).Y = (mobj->SpawnPoint).Y;
    (actor->SpawnPoint).X = (mobj->SpawnPoint).X;
    actor->SpawnAngle = mobj->SpawnAngle;
    actor->SpawnFlags = mobj->SpawnFlags & 0xffffffef;
    (actor->Angles).Yaw.Degrees = (double)mobj->SpawnAngle;
    (*(actor->super_DThinker).super_DObject._vptr_DObject[0xb])(actor);
    actor->reactiontime = 0x12;
    AActor::CopyFriendliness(actor,mobj,false,true);
    actor->Translation = mobj->Translation;
    actor->skillrespawncount = mobj->skillrespawncount;
    (actor->Prev).Z = dVar6;
    local_28.X = (mobj->__Pos).X;
    local_28.Y = (mobj->__Pos).Y;
    local_28.Z = (mobj->__Pos).Z;
    P_SpawnTeleportFog(mobj,&local_28,true,true);
    local_28.X = (mobj->SpawnPoint).X;
    local_28.Y = (mobj->SpawnPoint).Y;
    local_28.Z = dVar6;
    P_SpawnTeleportFog(mobj,&local_28,false,true);
    actor = mobj;
  }
  else {
    AActor::ClearCounters(actor);
  }
  (*(actor->super_DThinker).super_DObject._vptr_DObject[4])(actor);
  return;
}

Assistant:

void P_NightmareRespawn (AActor *mobj)
{
	double z;
	AActor *mo;
	AActor *info = mobj->GetDefault();

	mobj->skillrespawncount++;

	// spawn the new monster (assume the spawn will be good)
	if (info->flags & MF_SPAWNCEILING)
		z = ONCEILINGZ;
	else if (info->flags2 & MF2_SPAWNFLOAT)
		z = FLOATRANDZ;
	else
		z = ONFLOORZ;

	// spawn it
	mo = AActor::StaticSpawn(mobj->GetClass(), DVector3(mobj->SpawnPoint.X, mobj->SpawnPoint.Y, z), NO_REPLACE, true);

	if (z == ONFLOORZ)
	{
		mo->AddZ(mobj->SpawnPoint.Z);
		if (mo->Z() < mo->floorz)
		{ // Do not respawn monsters in the floor, even if that's where they
		  // started. The initial P_ZMovement() call would have put them on
		  // the floor right away, but we need them on the floor now so we
		  // can use P_CheckPosition() properly.
			mo->SetZ(mo->floorz);
		}
		if (mo->Top() > mo->ceilingz)
		{
			mo->SetZ(mo->ceilingz- mo->Height);
		}
	}
	else if (z == ONCEILINGZ)
	{
		mo->AddZ(-mobj->SpawnPoint.Z);
	}

	// If there are 3D floors, we need to find floor/ceiling again.
	P_FindFloorCeiling(mo, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);

	if (z == ONFLOORZ)
	{
		if (mo->Z() < mo->floorz)
		{ // Do not respawn monsters in the floor, even if that's where they
		  // started. The initial P_ZMovement() call would have put them on
		  // the floor right away, but we need them on the floor now so we
		  // can use P_CheckPosition() properly.
			mo->SetZ(mo->floorz);
		}
		if (mo->Top() > mo->ceilingz)
		{ // Do the same for the ceiling.
			mo->SetZ(mo->ceilingz - mo->Height);
		}
	}

	// something is occupying its position?
	if (!P_CheckPosition(mo, mo->Pos(), true))
	{
		//[GrafZahl] MF_COUNTKILL still needs to be checked here.
		mo->ClearCounters();
		mo->Destroy ();
		return;		// no respawn
	}

	z = mo->Z();

	// inherit attributes from deceased one
	mo->SpawnPoint = mobj->SpawnPoint;
	mo->SpawnAngle = mobj->SpawnAngle;
	mo->SpawnFlags = mobj->SpawnFlags & ~MTF_DORMANT;	// It wasn't dormant when it died, so it's not dormant now, either.
	mo->Angles.Yaw = (double)mobj->SpawnAngle;

	mo->HandleSpawnFlags ();
	mo->reactiontime = 18;
	mo->CopyFriendliness (mobj, false);
	mo->Translation = mobj->Translation;

	mo->skillrespawncount = mobj->skillrespawncount;

	mo->Prev.Z = z;		// Do not interpolate Z position if we changed it since spawning.

	// spawn a teleport fog at old spot because of removal of the body?
	P_SpawnTeleportFog(mobj, mobj->Pos(), true, true);

	// spawn a teleport fog at the new spot
	P_SpawnTeleportFog(mobj, DVector3(mobj->SpawnPoint, z), false, true);

	// remove the old monster
	mobj->Destroy ();
}